

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.cpp
# Opt level: O0

int __thiscall smf::MidiEvent::getTickDuration(MidiEvent *this)

{
  int iVar1;
  MidiEvent *pMVar2;
  int tick2;
  MidiEvent *mev;
  MidiEvent *this_local;
  
  pMVar2 = getLinkedEvent(this);
  if (pMVar2 == (MidiEvent *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    iVar1 = pMVar2->tick;
    if (this->tick < iVar1) {
      this_local._4_4_ = iVar1 - this->tick;
    }
    else {
      this_local._4_4_ = this->tick - iVar1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int MidiEvent::getTickDuration(void) const {
	const MidiEvent* mev = getLinkedEvent();
	if (mev == NULL) {
		return 0;
	}
	int tick2 = mev->tick;
	if (tick2 > tick) {
		return tick2 - tick;
	} else {
		return tick - tick2;
	}
}